

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  size_type *local_68;
  string negative;
  string positive;
  
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&negative.field_2 + 8);
  std::operator+(__return_storage_ptr__,test_case_name,".");
  std::operator+(&local_a8,__return_storage_ptr__,(test_name->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)(negative.field_2._M_local_buf + 8));
  pcVar1 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar3 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  negative.field_2._8_8_ = &positive._M_string_length;
  positive._M_dataplus._M_p = (pointer)0x0;
  local_68 = &negative._M_string_length;
  negative._M_dataplus._M_p = (pointer)0x0;
  positive._M_string_length._0_1_ = 0;
  negative._M_string_length._0_1_ = 0;
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::assign(negative.field_2._M_local_buf + 8);
    this = (string *)&local_68;
  }
  else {
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,pcVar1,pcVar3);
    this = (string *)(negative.field_2._M_local_buf + 8);
    std::__cxx11::string::operator=(this,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::string
              ((string *)local_88,pcVar3 + 1,(allocator *)(positive.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    if (positive._M_dataplus._M_p != (pointer)0x0) goto LAB_00122f1a;
  }
  std::__cxx11::string::assign((char *)this);
LAB_00122f1a:
  bVar2 = MatchesFilter(&local_a8,(char *)negative.field_2._8_8_);
  if (bVar2) {
    bVar2 = MatchesFilter(&local_a8,(char *)local_68);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)(negative.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  return bVar2;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}